

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O0

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)

{
  LdiscInputToken LVar1;
  uint32_t u;
  size_t sVar2;
  char local_29;
  undefined1 auStack_28 [3];
  undefined1 auStack_25 [4];
  char data [8];
  char c;
  Ldisc *ldisc_local;
  uint32_t uStack_10;
  LdiscInputToken tok;
  
  unique0x1000013c = ldisc;
  sVar2 = bufchain_size(&ldisc->input_queue);
  if (sVar2 == 0) {
    __assert_fail("bufchain_size(&ldisc->input_queue) > 0 && \"You\'re not supposed to call this unless there is buffered input!\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ldisc.c",0x120
                  ,"LdiscInputToken ldisc_get_input_token(Ldisc *)");
  }
  bufchain_fetch_consume(&stack0xffffffffffffffe0->input_queue,data,1);
  if (data[0] == -1) {
    bufchain_fetch_consume(&stack0xffffffffffffffe0->input_queue,&local_29,1);
    if (local_29 == -1) {
      ldisc_local._4_4_ = ldisc_local._4_4_ & 0xffffff00;
      uStack_10 = CONCAT31(uStack_10._1_3_,0xff);
    }
    else {
      bufchain_fetch_consume(&stack0xffffffffffffffe0->input_queue,auStack_28,7);
      ldisc_local._4_4_ = CONCAT31(ldisc_local._5_3_,1);
      uStack_10 = GET_32BIT_MSB_FIRST(&local_29);
      u = GET_32BIT_MSB_FIRST(auStack_25);
      tok._0_4_ = toint(u);
    }
  }
  else {
    ldisc_local._4_4_ = ldisc_local._4_4_ & 0xffffff00;
    uStack_10 = CONCAT31(uStack_10._1_3_,data[0]);
  }
  LVar1.field_1.field_1.code = uStack_10;
  LVar1._0_4_ = ldisc_local._4_4_;
  LVar1.field_1.field_1.arg = tok._0_4_;
  return LVar1;
}

Assistant:

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)
{
    assert(bufchain_size(&ldisc->input_queue) > 0 &&
           "You're not supposed to call this unless there is buffered input!");

    LdiscInputToken tok;

    char c;
    bufchain_fetch_consume(&ldisc->input_queue, &c, 1);
    if (c != '\xFF') {
        /* A literal non-FF byte */
        tok.is_special = false;
        tok.chr = c;
        return tok;
    } else {
        char data[8];

        /* See if the byte after the FF is also FF, indicating a literal FF */
        bufchain_fetch_consume(&ldisc->input_queue, data, 1);
        if (data[0] == '\xFF') {
            tok.is_special = false;
            tok.chr = '\xFF';
            return tok;
        }

        /* If not, get the rest of an 8-byte chunk and decode a special */
        bufchain_fetch_consume(&ldisc->input_queue, data+1, 7);
        tok.is_special = true;
        tok.code = GET_32BIT_MSB_FIRST(data);
        tok.arg = toint(GET_32BIT_MSB_FIRST(data+4));
        return tok;
    }
}